

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O2

MessageProcessingResult __thiscall
helics::ForwardingTimeCoordinator::checkExecEntry
          (ForwardingTimeCoordinator *this,GlobalFederateId param_1)

{
  bool bVar1;
  DependencyInfo *dep;
  pointer pDVar2;
  ActionMessage execgrant;
  
  bVar1 = TimeDependencies::checkIfReadyForExecEntry
                    (&(this->super_BaseTimeCoordinator).dependencies,false,false);
  if (!bVar1) {
    if ((this->downstream).super_TimeData.mTimeState != exec_requested_iterative) {
      return CONTINUE_PROCESSING;
    }
    for (pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pDVar2 != (this->super_BaseTimeCoordinator).dependencies.dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pDVar2 = pDVar2 + 1) {
      if (pDVar2->dependency == true) {
        if ((pDVar2->super_TimeData).minFed.gid != (this->super_BaseTimeCoordinator).mSourceId.gid)
        {
          return CONTINUE_PROCESSING;
        }
        if ((pDVar2->super_TimeData).responseSequenceCounter !=
            (this->downstream).super_TimeData.sequenceCounter) {
          return CONTINUE_PROCESSING;
        }
      }
    }
  }
  (this->super_BaseTimeCoordinator).executionMode = true;
  (this->downstream).super_TimeData.next.internalTimeCode = 0;
  (this->downstream).super_TimeData.mTimeState = time_granted;
  (this->downstream).super_TimeData.minDe.internalTimeCode = 0;
  ActionMessage::ActionMessage(&execgrant,cmd_exec_grant);
  execgrant.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  transmitTimingMessagesDownstream(this,&execgrant,(GlobalFederateId)0x8831d580);
  transmitTimingMessagesUpstream(this,&execgrant);
  ActionMessage::~ActionMessage(&execgrant);
  return NEXT_STEP;
}

Assistant:

MessageProcessingResult ForwardingTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;

    if (!dependencies.checkIfReadyForExecEntry(false, false)) {
        bool allowed{false};
        if (downstream.mTimeState == TimeState::exec_requested_iterative) {
            allowed = true;
            for (auto& dep : dependencies) {
                if (dep.dependency) {
                    if (dep.minFed != mSourceId) {
                        allowed = false;
                        break;
                    }
                    if (dep.responseSequenceCounter != downstream.sequenceCounter) {
                        allowed = false;
                        break;
                    }
                }
            }
        }
        if (!allowed) {
            return ret;
        }
    }
    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    downstream.next = timeZero;
    downstream.mTimeState = TimeState::time_granted;
    downstream.minDe = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}